

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_FonSetName(Cba_Ntk_t *p,int f,int x)

{
  int iVar1;
  int x_local;
  int f_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_NtkHasFonNames(p);
  if (iVar1 == 0) {
    __assert_fail("Cba_NtkHasFonNames(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0x11f,"void Cba_FonSetName(Cba_Ntk_t *, int, int)");
  }
  iVar1 = Cba_FonIsReal(f);
  if (iVar1 != 0) {
    iVar1 = Cba_FonName(p,f);
    if (iVar1 == 0) {
      Vec_IntSetEntry(&p->vFonName,f,x);
      return;
    }
    __assert_fail("Cba_FonName(p, f) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0x11f,"void Cba_FonSetName(Cba_Ntk_t *, int, int)");
  }
  __assert_fail("Cba_FonIsReal(f)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x11f,"void Cba_FonSetName(Cba_Ntk_t *, int, int)");
}

Assistant:

static inline void           Cba_FonSetName( Cba_Ntk_t * p, int f, int x )   { assert(Cba_NtkHasFonNames(p)); assert(Cba_FonIsReal(f)); assert(Cba_FonName(p, f) == 0); Vec_IntSetEntry(&p->vFonName, f, x); }